

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

void __thiscall mprpc::MpRpcClient::MpRpcClient(MpRpcClient *this,shared_ptr<Connection> *conn)

{
  rep rVar1;
  MessageLoop *this_00;
  MpRpcClient *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  Closure local_48;
  shared_ptr<Connection> *local_18;
  shared_ptr<Connection> *conn_local;
  MpRpcClient *this_local;
  
  local_18 = conn;
  conn_local = (shared_ptr<Connection> *)this;
  Connection_Callback::Connection_Callback(&this->super_Connection_Callback);
  loop::MsgLoopRun::MsgLoopRun(&this->super_MsgLoopRun);
  (this->super_Connection_Callback)._vptr_Connection_Callback = (_func_int **)&PTR_on_recv_00282210;
  (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)&PTR__MpRpcClient_00282248;
  std::__cxx11::string::string((string *)&this->m_addr);
  std::shared_ptr<Connection>::shared_ptr(&this->m_conn,conn);
  this->m_callback = (MpRpcClient_Callback *)0x0;
  this->m_connected = false;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->m_last_hb_rsp_time).__d.__r = rVar1;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_last_hb_time);
  std::
  unordered_map<int,_mprpc::MpRpcClient::OnRspHandler,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_mprpc::MpRpcClient::OnRspHandler>_>_>
  ::unordered_map(&this->m_on_rsp_map);
  std::__atomic_base<int>::operator=(&(this->m_cur_callid).super___atomic_base<int>,0);
  this_00 = loop::MsgLoopRun::msg_loop(&this->super_MsgLoopRun);
  local_70 = on_check_timer;
  local_68 = 0;
  local_78 = this;
  std::bind<void(mprpc::MpRpcClient::*)(),mprpc::MpRpcClient*>
            (&local_60,(offset_in_MpRpcClient_to_subr *)&local_70,&local_78);
  std::function<void()>::
  function<std::_Bind<void(mprpc::MpRpcClient::*(mprpc::MpRpcClient*))()>,void>
            ((function<void()> *)&local_48,&local_60);
  loop::MessageLoop::post_delayed_task(this_00,&local_48,100);
  std::function<void_()>::~function(&local_48);
  return;
}

Assistant:

MpRpcClient::MpRpcClient(shared_ptr<Connection> conn)
        : m_conn(conn)
        , m_callback(nullptr)
        , m_connected(false)
        , m_last_hb_rsp_time(system_clock::now())
        //, m_last_hb_time
    {
        m_cur_callid = 0;

        msg_loop().post_delayed_task(bind(&MpRpcClient::on_check_timer, this), 100);
    }